

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# map.c
# Opt level: O3

ecs_bucket_t * get_bucket(ecs_map_t *map,ecs_map_key_t key)

{
  int32_t bucket_count;
  uint uVar1;
  ecs_bucket_t *peVar2;
  
  bucket_count = map->bucket_count;
  if (bucket_count == 0) {
    peVar2 = (ecs_bucket_t *)0x0;
  }
  else {
    uVar1 = get_bucket_id(bucket_count,key);
    _ecs_assert((int)uVar1 < bucket_count,0xc,(char *)0x0,"bucket_id < bucket_count",
                "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/map.c"
                ,0x37);
    if (bucket_count <= (int)uVar1) {
      __assert_fail("bucket_id < bucket_count",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/duddel[P]flecs-lab/build_O3/flecs-clone-prefix/src/flecs-clone/src/map.c"
                    ,0x37,"ecs_bucket_t *get_bucket(const ecs_map_t *, ecs_map_key_t)");
    }
    peVar2 = map->buckets + uVar1;
  }
  return peVar2;
}

Assistant:

static
ecs_bucket_t* get_bucket(
    const ecs_map_t *map,
    ecs_map_key_t key)
{
    int32_t bucket_count = map->bucket_count;
    if (!bucket_count) {
        return NULL;
    }

    int32_t bucket_id = get_bucket_id(bucket_count, key);
    ecs_assert(bucket_id < bucket_count, ECS_INTERNAL_ERROR, NULL);

    return &map->buckets[bucket_id];
}